

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O3

gdImagePtr gdImageRotate270(gdImagePtr src,int ignoretransparent)

{
  int iVar1;
  int iVar2;
  gdImagePtr to;
  code *pcVar3;
  uint uVar4;
  int iVar5;
  
  if (src->trueColor == 0) {
    pcVar3 = gdImageGetPixel;
  }
  else {
    pcVar3 = gdImageGetTrueColorPixel;
  }
  to = gdImageCreateTrueColor(src->sy,src->sx);
  if (to != (gdImagePtr)0x0) {
    iVar1 = to->alphaBlendingFlag;
    to->alphaBlendingFlag = 0;
    to->transparent = src->transparent;
    gdImagePaletteCopy(to,src);
    iVar5 = src->sy;
    if (0 < iVar5) {
      iVar2 = src->sx;
      uVar4 = 0;
      do {
        if (0 < iVar2) {
          iVar5 = 0;
          do {
            iVar2 = (*pcVar3)(src,iVar5,uVar4);
            if (src->trueColor == 0) {
              iVar2 = src->green[iVar2] * 0x100 + src->red[iVar2] * 0x10000 + src->blue[iVar2] +
                      src->alpha[iVar2] * 0x1000000;
            }
            gdImageSetPixel(to,to->sx + ~uVar4,iVar5,iVar2);
            iVar5 = iVar5 + 1;
            iVar2 = src->sx;
          } while (iVar5 < iVar2);
          iVar5 = src->sy;
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < iVar5);
    }
    to->alphaBlendingFlag = iVar1;
  }
  return to;
}

Assistant:

gdImagePtr gdImageRotate270 (gdImagePtr src, int ignoretransparent)
{
	int uY, uX;
	int c,r,g,b,a;
	gdImagePtr dst;
	FuncPtr f;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}
	dst = gdImageCreateTrueColor (src->sy, src->sx);

	if (dst != NULL) {
		int old_blendmode = dst->alphaBlendingFlag;
		dst->alphaBlendingFlag = 0;

		dst->transparent = src->transparent;

		gdImagePaletteCopy (dst, src);

		for (uY = 0; uY<src->sy; uY++) {
			for (uX = 0; uX<src->sx; uX++) {
				c = f (src, uX, uY);
				if (!src->trueColor) {
					r = gdImageRed(src,c);
					g = gdImageGreen(src,c);
					b = gdImageBlue(src,c);
					a = gdImageAlpha(src,c);
					c = gdTrueColorAlpha(r, g, b, a);
				}

				if (ignoretransparent && c == dst->transparent) {
					gdImageSetPixel(dst, (dst->sx - uY - 1), uX, dst->transparent);
				} else {
					gdImageSetPixel(dst, (dst->sx - uY - 1), uX, c);
				}
			}
		}
		dst->alphaBlendingFlag = old_blendmode;
	}

	return dst;
}